

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O2

void makecorridors(level *lev,int style)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  schar *psVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  
  switch(style) {
  case 1:
    iVar14 = lev->nroom;
    if (1 < iVar14) {
      iVar8 = 0;
      for (uVar12 = 0; iVar9 = iVar8, (long)uVar12 < (long)iVar14; uVar12 = uVar12 + 1) {
        do {
          uVar3 = rn2(lev->nroom + -1);
          uVar6 = (ulong)uVar3;
          if ((uVar12 != uVar6) && (lev->rooms[uVar6].doorct == '\0')) {
            iVar8 = iVar9;
            if (iVar9 < 100) goto LAB_001cd219;
            break;
          }
          iVar8 = iVar9 + 1;
          bVar17 = iVar9 < 100;
          iVar9 = iVar8;
        } while (bVar17);
        iVar14 = lev->nroom;
        if (iVar14 < 2) {
          iVar14 = 1;
        }
        uVar3 = iVar14 - 1;
        uVar6 = (ulong)uVar3;
        psVar11 = &lev->rooms[0].doorct;
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          if ((uVar12 != uVar7) && (*psVar11 == '\0')) {
            uVar3 = (uint)uVar7;
            uVar6 = uVar7;
            break;
          }
          psVar11 = psVar11 + 0xd8;
        }
LAB_001cd219:
        join(lev,(int)uVar12,(uVar12 == uVar6) + uVar3,'\0');
        iVar14 = lev->nroom;
      }
    }
    break;
  case 2:
    iVar14 = 0;
    while (iVar14 < lev->nroom) {
      join(lev,iVar14,(iVar14 + 1) % lev->nroom,'\0');
      iVar14 = iVar14 + 1;
    }
    break;
  case 3:
    if (1 < (long)lev->nroom) {
      psVar11 = &lev->rooms[0].hy;
      iVar14 = 9999;
      uVar6 = 0;
      for (uVar12 = 0; (long)lev->nroom != uVar12; uVar12 = uVar12 + 1) {
        uVar3 = (int)psVar11[-2] - (int)((mkroom *)(psVar11 + -3))->lx;
        iVar9 = (int)(short)((int)((uint)(ushort)((short)uVar3 >> 0xf) << 0x10 | uVar3 & 0xffff) / 2
                            ) + (int)((mkroom *)(psVar11 + -3))->lx + -0x28;
        iVar8 = -iVar9;
        if (0 < iVar9) {
          iVar8 = iVar9;
        }
        uVar3 = (int)*psVar11 - (int)psVar11[-1];
        iVar10 = (int)(short)((int)((uint)(ushort)((short)uVar3 >> 0xf) << 0x10 | uVar3 & 0xffff) /
                             2) + (int)psVar11[-1] + -10;
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        if (iVar9 + iVar8 < iVar14) {
          uVar6 = uVar12 & 0xffffffff;
          iVar14 = iVar9 + iVar8;
        }
        psVar11 = psVar11 + 0xd8;
      }
      iVar8 = (int)uVar6;
      uVar12 = 0;
      iVar14 = 0;
      if (0 < iVar8) {
        uVar12 = uVar6;
        iVar14 = 0;
      }
      for (; iVar9 = iVar8, (int)uVar12 != iVar14; iVar14 = iVar14 + 1) {
        join(lev,iVar14,iVar8,'\0');
      }
      while (iVar9 = iVar9 + 1, iVar9 < lev->nroom) {
        join(lev,iVar9,iVar8,'\0');
      }
    }
    break;
  case 4:
    bVar17 = lev->rooms[0].lx == lev->rooms[2].lx;
    uVar4 = (uint)bVar17;
    uVar3 = (uint)bVar17;
    uVar5 = uVar3 + 2;
    for (iVar14 = 0; iVar8 = lev->nroom, iVar14 < (int)(iVar8 - uVar5); iVar14 = iVar14 + uVar5) {
      uVar2 = rn2(uVar5);
      uVar12 = (ulong)uVar2;
      join(lev,uVar2 + iVar14,uVar2 + iVar14 + uVar5,'\0');
      iVar8 = uVar4 + 1;
      while (bVar17 = iVar8 != 0, iVar8 = iVar8 + -1, bVar17) {
        uVar2 = mt_random();
        if ((uVar2 & 3) == 0) {
          uVar12 = (ulong)((int)uVar12 + 1) % (ulong)uVar5;
          iVar9 = (int)uVar12 + iVar14;
          join(lev,iVar9,iVar9 + uVar5,'\0');
        }
      }
    }
    piVar13 = smeq;
    for (uVar12 = 0; uVar12 != uVar3 + 1; uVar12 = uVar12 + 1) {
      uVar2 = rn2(iVar8 / (int)uVar5);
      uVar6 = (ulong)uVar2;
      iVar9 = (int)uVar12;
      join(lev,uVar2 * uVar5 + iVar9,uVar2 * uVar5 + iVar9 + 1,'\0');
      for (iVar14 = 1; iVar8 = lev->nroom, iVar14 < iVar8 / (int)uVar5; iVar14 = iVar14 + 1) {
        uVar2 = mt_random();
        if ((uVar2 & 3) == 0) {
          iVar8 = rn2(lev->nroom / (int)uVar5 - iVar14);
          iVar10 = lev->nroom / (int)uVar5;
          uVar6 = (long)(iVar8 + (int)uVar6) % (long)iVar10 & 0xffffffff;
          lVar15 = uVar6 * (uVar5 * 4);
          do {
            iVar8 = (int)uVar6;
            if (*(int *)((long)piVar13 + lVar15) != *(int *)((long)piVar13 + lVar15 + 4)) break;
            uVar6 = (ulong)(iVar8 + 1);
            lVar15 = lVar15 + (ulong)(uVar5 * 4);
          } while (iVar8 < (lev->nroom * 2) / (int)uVar5);
          uVar7 = (long)iVar8 % (long)iVar10;
          uVar6 = uVar7 & 0xffffffff;
          iVar8 = (int)uVar7 * uVar5;
          join(lev,iVar8 + iVar9,iVar8 + iVar9 + 1,'\0');
        }
      }
      piVar13 = piVar13 + 1;
    }
    for (uVar3 = 0; uVar2 = uVar3, (int)uVar3 < iVar8; uVar3 = uVar3 + 1) {
      while( true ) {
        iVar14 = smeq[(int)uVar2];
        uVar1 = smeq[iVar14];
        if (iVar14 <= (int)uVar1) break;
        smeq[(int)uVar2] = uVar1;
        uVar2 = uVar1;
      }
      if (iVar14 != 0) {
        join(lev,uVar3,(-(uint)(uVar3 % uVar5 != 0) | -uVar4 - 2) + uVar3,'\0');
      }
      iVar8 = lev->nroom;
    }
    break;
  default:
    iVar14 = 1;
    do {
      if (lev->nroom + -1 <= iVar14 + -1) break;
      join(lev,iVar14 + -1,iVar14,'\0');
      uVar3 = mt_random();
      iVar14 = iVar14 + 1;
    } while (uVar3 % 0x32 != 0);
    lVar15 = 0;
    while( true ) {
      uVar12 = (ulong)lev->nroom;
      if ((long)(uVar12 - 2) <= lVar15) break;
      if (smeq[lVar15] != smeq[lVar15 + 2]) {
        join(lev,(int)lVar15,(int)lVar15 + 2,'\0');
      }
      lVar15 = lVar15 + 1;
    }
    bVar17 = true;
    for (lVar15 = 0; (iVar14 = (int)uVar12, bVar17 && (lVar15 < iVar14)); lVar15 = lVar15 + 1) {
      bVar17 = false;
      for (lVar16 = 0; lVar16 < (int)uVar12; lVar16 = lVar16 + 1) {
        if (smeq[lVar15] != smeq[lVar16]) {
          join(lev,(int)lVar15,(int)lVar16,'\0');
          uVar12 = (ulong)(uint)lev->nroom;
          bVar17 = true;
        }
      }
    }
    if (2 < iVar14) {
      iVar14 = rn2(iVar14);
      iVar14 = iVar14 + 4;
      while (bVar17 = iVar14 != 0, iVar14 = iVar14 + -1, bVar17) {
        uVar4 = rn2(lev->nroom);
        uVar5 = rn2(lev->nroom + -2);
        uVar3 = uVar5 + 2;
        if (uVar5 < uVar4) {
          uVar3 = uVar5;
        }
        join(lev,uVar4,uVar3,'\x01');
      }
    }
  }
  return;
}

Assistant:

void makecorridors(struct level *lev, int style)
{
	int a, b, i;
	boolean any = TRUE;

	switch (style) {
	case LEVSTYLE_STANDARD:
	default: /* vanilla style */
	    for (a = 0; a < lev->nroom - 1; a++) {
		join(lev, a, a + 1, FALSE);
		if (!rn2(50))
		    break; /* allow some randomness */
	    }
	    for (a = 0; a < lev->nroom - 2; a++) {
		if (smeq[a] != smeq[a + 2])
		    join(lev, a, a + 2, FALSE);
	    }
	    for (a = 0; any && a < lev->nroom; a++) {
		any = FALSE;
		for (b = 0; b < lev->nroom; b++) {
		    if (smeq[a] != smeq[b]) {
			join(lev, a, b, FALSE);
			any = TRUE;
		    }
		}
	    }
	    if (lev->nroom > 2) {
		for (i = rn2(lev->nroom) + 4; i; i--) {
		    a = rn2(lev->nroom);
		    b = rn2(lev->nroom - 2);
		    if (b >= a)
			b += 2;
		    join(lev, a, b, TRUE);
		}
	    }
	    break;

	case LEVSTYLE_ANYTOANY: /* at least one corridor leaves from each room
				 * and goes to a random room */
	    if (lev->nroom > 1) {
		int cnt = 0;
		for (a = 0; a < lev->nroom; a++) {
		    do {
			b = rn2(lev->nroom - 1);
		    } while ((a == b || lev->rooms[b].doorct) && cnt++ < 100);
		    if (cnt >= 100) {
			for (b = 0; b < lev->nroom - 1; b++) {
			    if (!lev->rooms[b].doorct && a != b)
				break;
			}
		    }
		    if (a == b)
			b++;
		    join(lev, a, b, FALSE);
		}
	    }
	    break;

	case LEVSTYLE_RING: /* circular path:
			     * room1 -> room2 -> room3 -> ... -> room1 */
	    for (a = 0; a < lev->nroom; a++) {
		b = (a + 1) % lev->nroom;
		join(lev, a, b, FALSE);
	    }
	    break;

	case LEVSTYLE_HUB: /* all roads lead to rome... or to the first room */
	    if (lev->nroom > 1) {
		/* find the most central room Manhattan-style */
		int mindist = 9999; /* arbitrary big number */
		b = 0;
		for (i = 0; i < lev->nroom; i++) {
		    struct mkroom *r = &lev->rooms[i];
		    int cx = abs(r->lx + (r->hx - r->lx) / 2 - COLNO / 2);
		    int cy = abs(r->ly + (r->hy - r->ly) / 2 - ROWNO / 2);
		    if (cx + cy < mindist) {
			b = i;
			mindist = cx + cy;
		    }
		}

		for (a = 0; a < b; a++)
		    join(lev, a, b, FALSE);
		for (a = b + 1; a < lev->nroom; a++)
		    join(lev, a, b, FALSE);
	    }
	    break;

	case LEVSTYLE_GRID: /* rooms should be in column-major order */
	    {
		/* First, we need to establish whether the grid height is 2 or 3. */
		int grid_height = (lev->rooms[0].lx == lev->rooms[2].lx) ? 3 : 2;
		int r;

		/* Make random horizontal joins, at least one per column. */
		for (a = 0; a < lev->nroom - grid_height; a += grid_height) {
		    r = rn2(grid_height);
		    join(lev, a + r, a + r + grid_height, FALSE);

		    for (b = 1; b < grid_height; b++) {
			if (!rn2(4)) {
			    r = (r + 1) % grid_height;
			    join(lev, a + r, a + r + grid_height, FALSE);
			}
		    }
		}

		/* Make vertical joins, at least one per row. */
		for (b = 0; b < grid_height - 1; b++) {
		    r = rn2(lev->nroom / grid_height);
		    join(lev, b+grid_height*r, b+grid_height*r+1, FALSE);

		    for (a = 1; a < lev->nroom / grid_height; a++) {
			if (!rn2(4)) {
			    /* Pick a random column. */
			    r = (r + rn2(lev->nroom / grid_height - a)) %
				(lev->nroom / grid_height);
			    /* Move along to one that isn't already joined. */
			    while (smeq[b+grid_height*r] == smeq[b+grid_height*r+1] &&
				   r < 2 * lev->nroom / grid_height) {
				r++;
			    }
			    r %= lev->nroom / grid_height;
			    /* Join it. */
			    join(lev, b+grid_height*r, b+grid_height*r+1, FALSE);
			}
		    }
		}

		/* Finally, just make sure that all rooms are connected. */
		for (a = 0; a < lev->nroom; a++) {
		    b = a;
		    while (smeq[b] > smeq[smeq[b]]) {
			smeq[b] = smeq[smeq[b]]; /* Just to speed up later checks. */
			b = smeq[b];
		    }
		    if (smeq[b] != 0) {
			/*
			 * Well, we know that the rooms before this one are connected
			 * to room 0...
			 */
			if (a % grid_height == 0) {
			    join(lev, a, a - grid_height, FALSE);
			} else {
			    join(lev, a, a - 1, FALSE);
			}
		    }
		}
	    }
	    break;
	}
}